

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_dict.cc
# Opt level: O1

bool brotli::IsMatch(DictWord w,uint8_t *data,size_t max_length)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  bool bVar10;
  byte local_9;
  
  uVar6 = (ulong)(uint)w & 0xff;
  if (max_length < uVar6) {
    local_9 = 0;
  }
  else {
    uVar5 = (uint)uVar6;
    uVar2 = (ulong)(((uint)w >> 0x10) * uVar5 + kBrotliDictionaryOffsetsByLength[uVar6]);
    pbVar8 = kBrotliDictionary + uVar2;
    if (w.transform == '\0') {
      if (7 < uVar5) {
        uVar2 = (ulong)(uVar5 & 0xfffffff8);
        pbVar7 = data + uVar2;
        uVar3 = 0;
LAB_00189aa2:
        if (*(ulong *)(data + uVar3) == *(ulong *)(pbVar8 + uVar3)) goto code_r0x00189aaf;
        uVar4 = *(ulong *)(pbVar8 + uVar3) ^ *(ulong *)(data + uVar3);
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar3 = (uVar2 >> 3 & 0x1fffffff) + uVar3;
        goto LAB_00189b1a;
      }
      uVar2 = 0;
      pbVar7 = data;
LAB_00189b3b:
      uVar4 = (ulong)(uint)w & 7;
      uVar3 = uVar2;
      if (((uint)w & 7) != 0) {
        uVar9 = uVar2 | uVar4;
        do {
          uVar3 = uVar2;
          if (pbVar8[uVar2] != *pbVar7) break;
          pbVar7 = pbVar7 + 1;
          uVar2 = uVar2 + 1;
          uVar4 = uVar4 - 1;
          uVar3 = uVar9;
        } while (uVar4 != 0);
      }
LAB_00189b1a:
      local_9 = uVar3 == uVar6;
    }
    else if (((uint)w >> 8 & 0xff) == 10) {
      if (((byte)(*pbVar8 + 0x9f) < 0x1a) && ((*pbVar8 ^ *data) == 0x20)) {
        IsMatch();
      }
      else {
        local_9 = 0;
      }
    }
    else {
      local_9 = ((uint)w & 0xff) == 0;
      if (!(bool)local_9) {
        uVar3 = 1;
        do {
          bVar1 = *(byte *)(uVar2 + 0x1d4f6f + uVar3);
          if ((byte)(bVar1 + 0x9f) < 0x1a) {
            if ((data[uVar3 - 1] ^ bVar1) != 0x20) break;
          }
          else if (bVar1 != data[uVar3 - 1]) break;
          local_9 = uVar6 <= uVar3;
          bVar10 = uVar3 != uVar6;
          uVar3 = uVar3 + 1;
        } while (bVar10);
      }
    }
  }
  return (bool)(local_9 & 1);
code_r0x00189aaf:
  uVar3 = uVar3 + 8;
  if (uVar2 == uVar3) goto LAB_00189b3b;
  goto LAB_00189aa2;
}

Assistant:

inline bool IsMatch(DictWord w, const uint8_t* data, size_t max_length) {
  if (w.len > max_length) return false;
  const size_t offset = kBrotliDictionaryOffsetsByLength[w.len] + w.len * w.idx;
  const uint8_t* dict = &kBrotliDictionary[offset];
  if (w.transform == 0) {
    // Match against base dictionary word.
    return FindMatchLengthWithLimit(dict, data, w.len) == w.len;
  } else if (w.transform == 10) {
    // Match against uppercase first transform.
    // Note that there are only ASCII uppercase words in the lookup table.
    return (dict[0] >= 'a' && dict[0] <= 'z' &&
            (dict[0] ^ 32) == data[0] &&
            FindMatchLengthWithLimit(&dict[1], &data[1], w.len - 1u) ==
            w.len - 1u);
  } else {
    // Match against uppercase all transform.
    // Note that there are only ASCII uppercase words in the lookup table.
    for (size_t i = 0; i < w.len; ++i) {
      if (dict[i] >= 'a' && dict[i] <= 'z') {
        if ((dict[i] ^ 32) != data[i]) return false;
      } else {
        if (dict[i] != data[i]) return false;
      }
    }
    return true;
  }
}